

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jfdctint.c
# Opt level: O0

void jpeg_fdct_2x4(DCTELEM *data,JSAMPARRAY sample_data,JDIMENSION start_col)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  byte *pbVar7;
  long lVar8;
  uint in_EDX;
  long in_RSI;
  int *in_RDI;
  int ctr;
  JSAMPROW elemptr;
  DCTELEM *dataptr;
  INT32 tmp11;
  INT32 tmp10;
  INT32 tmp1;
  INT32 tmp0;
  int local_4c;
  int *local_40;
  
  memset(in_RDI,0,0x100);
  local_40 = in_RDI;
  for (local_4c = 0; local_4c < 4; local_4c = local_4c + 1) {
    pbVar7 = (byte *)(*(long *)(in_RSI + (long)local_4c * 8) + (ulong)in_EDX);
    uVar5 = (uint)*pbVar7;
    uVar6 = (uint)pbVar7[1];
    *local_40 = (uVar5 + uVar6 + -0x100) * 8;
    local_40[1] = (uVar5 - uVar6) * 8;
    local_40 = local_40 + 8;
  }
  local_40 = in_RDI;
  for (local_4c = 0; local_4c < 2; local_4c = local_4c + 1) {
    iVar1 = *local_40;
    iVar2 = *local_40;
    iVar3 = local_40[8];
    iVar4 = local_40[0x10];
    *local_40 = iVar1 + local_40[0x18] + local_40[8] + local_40[0x10];
    local_40[0x10] = (iVar1 + local_40[0x18]) - (local_40[8] + local_40[0x10]);
    lVar8 = ((long)(iVar2 - local_40[0x18]) + (long)(iVar3 - iVar4)) * 0x1151 + 0x1000;
    local_40[8] = (int)(lVar8 + (long)(iVar2 - local_40[0x18]) * 0x187e >> 0xd);
    local_40[0x18] = (int)(lVar8 + (long)(iVar3 - iVar4) * -0x3b21 >> 0xd);
    local_40 = local_40 + 1;
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_fdct_2x4 (DCTELEM * data, JSAMPARRAY sample_data, JDIMENSION start_col)
{
  INT32 tmp0, tmp1;
  INT32 tmp10, tmp11;
  DCTELEM *dataptr;
  JSAMPROW elemptr;
  int ctr;
  SHIFT_TEMPS

  /* Pre-zero output coefficient block. */
  MEMZERO(data, SIZEOF(DCTELEM) * DCTSIZE2);

  /* Pass 1: process rows. */
  /* Note results are scaled up by sqrt(8) compared to a true DCT. */
  /* We must also scale the output by (8/2)*(8/4) = 2**3, which we add here. */

  dataptr = data;
  for (ctr = 0; ctr < 4; ctr++) {
    elemptr = sample_data[ctr] + start_col;

    /* Even part */

    tmp0 = GETJSAMPLE(elemptr[0]);
    tmp1 = GETJSAMPLE(elemptr[1]);

    /* Apply unsigned->signed conversion */
    dataptr[0] = (DCTELEM) ((tmp0 + tmp1 - 2 * CENTERJSAMPLE) << 3);

    /* Odd part */

    dataptr[1] = (DCTELEM) ((tmp0 - tmp1) << 3);

    dataptr += DCTSIZE;		/* advance pointer to next row */
  }

  /* Pass 2: process columns.
   * We leave the results scaled up by an overall factor of 8.
   * 4-point FDCT kernel,
   * cK represents sqrt(2) * cos(K*pi/16) [refers to 8-point FDCT].
   */

  dataptr = data;
  for (ctr = 0; ctr < 2; ctr++) {
    /* Even part */

    tmp0 = dataptr[DCTSIZE*0] + dataptr[DCTSIZE*3];
    tmp1 = dataptr[DCTSIZE*1] + dataptr[DCTSIZE*2];

    tmp10 = dataptr[DCTSIZE*0] - dataptr[DCTSIZE*3];
    tmp11 = dataptr[DCTSIZE*1] - dataptr[DCTSIZE*2];

    dataptr[DCTSIZE*0] = (DCTELEM) (tmp0 + tmp1);
    dataptr[DCTSIZE*2] = (DCTELEM) (tmp0 - tmp1);

    /* Odd part */

    tmp0 = MULTIPLY(tmp10 + tmp11, FIX_0_541196100);       /* c6 */
    /* Add fudge factor here for final descale. */
    tmp0 += ONE << (CONST_BITS-1);

    dataptr[DCTSIZE*1] = (DCTELEM)
      RIGHT_SHIFT(tmp0 + MULTIPLY(tmp10, FIX_0_765366865), /* c2-c6 */
		  CONST_BITS);
    dataptr[DCTSIZE*3] = (DCTELEM)
      RIGHT_SHIFT(tmp0 - MULTIPLY(tmp11, FIX_1_847759065), /* c2+c6 */
		  CONST_BITS);

    dataptr++;			/* advance pointer to next column */
  }
}